

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O3

void __thiscall JumpBasic::analyzeGuards(JumpBasic *this,BlockBasic *bl,int4 pathout)

{
  pointer *ppGVar1;
  int iVar2;
  pointer pGVar3;
  pointer pBVar4;
  int4 path;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  Varnode *v;
  long lVar7;
  bool bVar8;
  GuardRecord *pGVar9;
  iterator iVar10;
  bool bVar11;
  byte bVar12;
  CircleRange rng;
  Varnode *markup;
  CircleRange local_a0;
  Varnode *local_80;
  GuardRecord local_78;
  PcodeOp *op;
  
  bVar12 = 0;
  pGVar3 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar2 = ((this->super_JumpModel).jumptable)->recoverystage;
  if ((this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar3) {
    (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar3;
  }
  bVar8 = true;
  do {
    if ((pathout < 0) ||
       ((int)((ulong)((long)(bl->super_FlowBlock).outofthis.
                            super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(bl->super_FlowBlock).outofthis.
                           super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 2)) {
      do {
        pBVar4 = (bl->super_FlowBlock).intothis.
                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(bl->super_FlowBlock).intothis.
                                super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pBVar4) >> 3) *
            -0x55555555 != 1) {
          return;
        }
        bl = (BlockBasic *)pBVar4->point;
      } while ((int)((ulong)((long)(bl->super_FlowBlock).outofthis.
                                   super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(bl->super_FlowBlock).outofthis.
                                  super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) * -0x55555555 == 1);
      pathout = pBVar4->reverse_index;
    }
    iVar6 = (*(bl->super_FlowBlock)._vptr_FlowBlock[0xe])(bl);
    op = (PcodeOp *)CONCAT44(extraout_var,iVar6);
    if (op == (PcodeOp *)0x0) {
      return;
    }
    if (op->opcode->opcode != CPUI_CBRANCH) {
      return;
    }
    v = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_start[1];
    CircleRange::CircleRange(&local_a0,(bool)((byte)(op->flags >> 8) & 1 ^ pathout + -1 == 0));
    path = -(pathout + -1);
    if (((bl->super_FlowBlock).flags >> 0x10 & 1) == 0) {
      path = pathout;
    }
    GuardRecord::GuardRecord(&local_78,op,path,&local_a0,v);
    iVar10._M_current =
         (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<GuardRecord,_std::allocator<GuardRecord>_>::_M_realloc_insert<GuardRecord>
                (&this->selectguards,iVar10,&local_78);
    }
    else {
      pGVar9 = &local_78;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        (iVar10._M_current)->cbranch = pGVar9->cbranch;
        pGVar9 = (GuardRecord *)((long)pGVar9 + (ulong)bVar12 * -0x10 + 8);
        iVar10._M_current = iVar10._M_current + (ulong)bVar12 * -0x10 + 8;
      }
      ppGVar1 = &(this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppGVar1 = *ppGVar1 + 1;
    }
    bVar5 = true;
    do {
      bVar11 = bVar5;
      if ((((v->flags & 0x10) == 0) ||
          (v = CircleRange::pullBack(&local_a0,v->def,&local_80,iVar2 == 0), v == (Varnode *)0x0))
         || (local_a0.isempty != false)) break;
      GuardRecord::GuardRecord(&local_78,op,path,&local_a0,v);
      iVar10._M_current =
           (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<GuardRecord,_std::allocator<GuardRecord>_>::_M_realloc_insert<GuardRecord>
                  (&this->selectguards,iVar10,&local_78);
      }
      else {
        pGVar9 = &local_78;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          (iVar10._M_current)->cbranch = pGVar9->cbranch;
          pGVar9 = (GuardRecord *)((long)pGVar9 + (ulong)bVar12 * -0x10 + 8);
          iVar10._M_current = iVar10._M_current + (ulong)bVar12 * -0x10 + 8;
        }
        ppGVar1 = &(this->selectguards).
                   super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      bVar5 = false;
    } while (bVar11);
    pathout = -1;
    bVar5 = !bVar8;
    bVar8 = false;
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void JumpBasic::analyzeGuards(BlockBasic *bl,int4 pathout)

{ // Analyze each CBRANCH leading up to -bl- switch.
  // (if pathout>=0, also analyze the CBRANCH in -bl- that chooses this path)
  // Analyze the range restrictions on the various variables which allow
  // control flow to pass through the CBRANCHs to the switch.
  // Make note of all these restrictions in the guard list
  // For later determination of the correct switch variable.
  int4 i,j,indpath;
  int4 maxbranch = 2;		// Maximum number of CBRANCHs to consider
  int4 maxpullback = 2;
  bool usenzmask = (jumptable->getStage() == 0);

  selectguards.clear();
  BlockBasic *prevbl;
  Varnode *vn;

  for(i=0;i<maxbranch;++i) {
    if ((pathout>=0)&&(bl->sizeOut()==2)) {
      prevbl = bl;
      bl = (BlockBasic *)prevbl->getOut(pathout);
      indpath = pathout;
      pathout = -1;
    }
    else {
      pathout = -1;		// Make sure not to use pathout next time around
      for(;;) {
	if (bl->sizeIn() != 1) return; // Assume only 1 path to switch
	prevbl = (BlockBasic *)bl->getIn(0);
	if (prevbl->sizeOut() != 1) break; // Is it possible to deviate from switch path in this block
	bl = prevbl;		// If not, back up to next block
      }
      indpath = bl->getInRevIndex(0);
    }
    PcodeOp *cbranch = prevbl->lastOp();
    if ((cbranch==(PcodeOp *)0)||(cbranch->code() != CPUI_CBRANCH))
      break;
    bool toswitchval = (indpath == 1);
    if (cbranch->isBooleanFlip())
      toswitchval = !toswitchval;
    bl = prevbl;
    vn = cbranch->getIn(1);
    CircleRange rng(toswitchval);
    
    // The boolean variable could conceivably be the switch variable
    int4 indpathstore = prevbl->getFlipPath() ? 1-indpath : indpath;
    selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    for(j=0;j<maxpullback;++j) {
      Varnode *markup;		// Throw away markup information
      if (!vn->isWritten()) break;
      vn = rng.pullBack(vn->getDef(),&markup,usenzmask);
      if (vn == (Varnode *)0) break;
      if (rng.isEmpty()) break;
      selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    }
  }
}